

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

Type_Conversion chaiscript::type_conversion<char_const*,std::__cxx11::string>(void)

{
  element_type *in_RDI;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> sVar1;
  Type_Conversion TVar2;
  anon_class_1_0_00000001_for_m_func local_48 [24];
  Type_Info local_30;
  undefined1 local_11;
  anon_class_1_0_00000001_for_m_func func;
  
  local_11 = 0;
  user_type<char_const*>();
  user_type<std::__cxx11::string>();
  sVar1 = make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Type_Conversion_Impl<chaiscript::type_conversion<char_const*,std::__cxx11::string>()::_lambda(chaiscript::Boxed_Value_const&)_1_>,chaiscript::Type_Info,chaiscript::Type_Info,chaiscript::type_conversion<char_const*,std::__cxx11::string>()::_lambda(chaiscript::Boxed_Value_const&)_1_&>
                    ((Type_Info *)in_RDI,&local_30,local_48);
  TVar2.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = sVar1.
                super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  TVar2.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (Type_Conversion)
         TVar2.
         super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Type_Conversion type_conversion() {
    static_assert(std::is_convertible<From, To>::value, "Types are not automatically convertible");
    auto func = [](const Boxed_Value &t_bv) -> Boxed_Value {
      // not even attempting to call boxed_cast so that we don't get caught in some call recursion
      return chaiscript::Boxed_Value(To(detail::Cast_Helper<From>::cast(t_bv, nullptr)));
    };

    return chaiscript::make_shared<detail::Type_Conversion_Base, detail::Type_Conversion_Impl<decltype(func)>>(user_type<From>(),
                                                                                                               user_type<To>(),
                                                                                                               func);
  }